

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void remove_short_regions(REGIONS *regions,int *num_regions,REGION_TYPES type,int length)

{
  long lVar1;
  int k;
  int local_2c;
  
  local_2c = 0;
  if (1 < *num_regions) {
    do {
      lVar1 = (long)local_2c;
      if (((regions[lVar1].last - regions[lVar1].start) + 1 < length) &&
         (regions[lVar1].type == type)) {
        remove_region(2,regions,num_regions,&local_2c);
      }
      else {
        local_2c = local_2c + 1;
      }
    } while ((local_2c < *num_regions) && (1 < *num_regions));
  }
  cleanup_regions(regions,num_regions);
  return;
}

Assistant:

static void remove_short_regions(REGIONS *regions, int *num_regions,
                                 REGION_TYPES type, int length) {
  int k = 0;
  while (k < *num_regions && (*num_regions) > 1) {
    if ((regions[k].last - regions[k].start + 1 < length &&
         regions[k].type == type)) {
      // merge current region with the previous and next regions
      remove_region(2, regions, num_regions, &k);
    } else {
      k++;
    }
  }
  cleanup_regions(regions, num_regions);
}